

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

Option * __thiscall CLI::App::add_flag(App *this,string *flag_name,string *description)

{
  bool bVar1;
  Option *pOVar2;
  IncorrectConstruction *__return_storage_ptr__;
  string local_e0;
  string local_c0;
  function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>
  local_a0;
  string local_70;
  Option *local_50;
  Option *opt;
  undefined1 local_40 [8];
  callback_t fun;
  string *description_local;
  string *flag_name_local;
  App *this_local;
  
  fun._M_invoker = (_Invoker_type)description;
  ::std::function<bool(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>)>::
  function<CLI::App::add_flag(std::__cxx11::string,std::__cxx11::string)::_lambda(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>)_1_,void>
            ((function<bool(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>)>
              *)local_40,(anon_class_1_0_00000001 *)((long)&opt + 7));
  ::std::__cxx11::string::string((string *)&local_70,(string *)flag_name);
  std::
  function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>
  ::function(&local_a0,
             (function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>
              *)local_40);
  ::std::__cxx11::string::string((string *)&local_c0,(string *)description);
  pOVar2 = add_option(this,&local_70,&local_a0,&local_c0,false);
  ::std::__cxx11::string::~string((string *)&local_c0);
  std::
  function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>
  ::~function(&local_a0);
  ::std::__cxx11::string::~string((string *)&local_70);
  local_50 = pOVar2;
  bVar1 = Option::get_positional(pOVar2);
  if (!bVar1) {
    Option::type_size(local_50,0);
    pOVar2 = local_50;
    std::
    function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>
    ::~function((function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>
                 *)local_40);
    return pOVar2;
  }
  __return_storage_ptr__ = (IncorrectConstruction *)__cxa_allocate_exception(0x38);
  ::std::__cxx11::string::string((string *)&local_e0,(string *)flag_name);
  IncorrectConstruction::PositionalFlag(__return_storage_ptr__,&local_e0);
  __cxa_throw(__return_storage_ptr__,&IncorrectConstruction::typeinfo,
              IncorrectConstruction::~IncorrectConstruction);
}

Assistant:

Option *add_flag(std::string flag_name, std::string description = "") {
        CLI::callback_t fun = [](CLI::results_t) { return true; };

        Option *opt = add_option(flag_name, fun, description, false);
        if(opt->get_positional())
            throw IncorrectConstruction::PositionalFlag(flag_name);
        opt->type_size(0);
        return opt;
    }